

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  seqDef *psVar1;
  int iVar2;
  bool bVar3;
  seqStore_t *psVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  uint uVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  BYTE *ip;
  ulong uVar14;
  int *piVar15;
  uint uVar16;
  ulong uVar17;
  U32 UVar18;
  size_t sVar19;
  int *piVar20;
  size_t offsetFound;
  int *local_c0;
  size_t local_a8;
  BYTE *local_a0;
  int *local_98;
  ulong local_90;
  ulong local_88;
  BYTE *local_80;
  ulong local_78;
  BYTE *local_70;
  uint local_64;
  BYTE *local_60;
  ZSTD_matchState_t *local_58;
  uint local_4c;
  seqStore_t *local_48;
  uint *local_40;
  BYTE *local_38;
  
  iEnd = (BYTE *)((long)src + srcSize);
  local_98 = (int *)((long)src + (srcSize - 8));
  local_70 = (ms->window).base;
  pBVar11 = (ms->window).dictBase;
  uVar6 = (ms->window).dictLimit;
  uVar14 = (ulong)uVar6;
  uVar17 = (ulong)(ms->window).lowLimit;
  local_a0 = local_70 + uVar14;
  uVar7 = *rep;
  uVar10 = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  piVar20 = (int *)((ulong)(local_a0 == (BYTE *)src) + (long)src);
  local_40 = rep;
  if (piVar20 < local_98) {
    local_60 = pBVar11 + uVar14;
    local_38 = pBVar11 + uVar17;
    iVar5 = uVar6 - 1;
    local_90 = uVar17;
    local_88 = uVar14;
    local_80 = pBVar11;
    local_58 = ms;
    local_48 = seqStore;
    do {
      uVar6 = (int)piVar20 - (int)local_70;
      local_78 = (ulong)uVar6;
      uVar6 = (uVar6 - uVar7) + 1;
      pBVar12 = local_70;
      if (uVar6 < (uint)uVar14) {
        pBVar12 = pBVar11;
      }
      local_64 = uVar10;
      if (((uint)uVar17 < uVar6 && 2 < iVar5 - uVar6) &&
         (*(int *)((long)piVar20 + 1) == *(int *)(pBVar12 + uVar6))) {
        pBVar11 = iEnd;
        if (uVar6 < (uint)uVar14) {
          pBVar11 = local_60;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar20 + 5),(BYTE *)((long)(pBVar12 + uVar6) + 4),iEnd,
                           pBVar11,local_a0);
        uVar14 = sVar8 + 4;
      }
      else {
        uVar14 = 0;
      }
      local_a8 = 999999999;
      sVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_58,(BYTE *)piVar20,iEnd,&local_a8);
      sVar8 = uVar14;
      if (uVar14 < sVar9) {
        sVar8 = sVar9;
      }
      if (sVar8 < 4) {
        piVar20 = (int *)((long)piVar20 + ((long)piVar20 - (long)src >> 8) + 1);
        pBVar11 = local_80;
        uVar14 = local_88;
        uVar17 = local_90;
        piVar15 = local_98;
        uVar10 = local_64;
      }
      else {
        local_c0 = piVar20;
        sVar19 = local_a8;
        if (sVar9 <= uVar14) {
          local_c0 = (int *)((long)piVar20 + 1);
          sVar19 = 0;
        }
        uVar14 = local_78;
        local_4c = uVar7;
        if (piVar20 < local_98) {
          do {
            piVar15 = (int *)((long)piVar20 + 1);
            uVar6 = (int)uVar14 + 1;
            local_78 = uVar14;
            if (sVar19 == 0) {
              sVar19 = 0;
            }
            else {
              uVar7 = uVar6 - uVar7;
              pBVar11 = local_70;
              if (uVar7 < (uint)local_88) {
                pBVar11 = local_80;
              }
              if (((uint)local_90 < uVar7 && 2 < iVar5 - uVar7) &&
                 (*piVar15 == *(int *)(pBVar11 + uVar7))) {
                pBVar12 = iEnd;
                if (uVar7 < (uint)local_88) {
                  pBVar12 = local_60;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar20 + 5),(BYTE *)((long)(pBVar11 + uVar7) + 4)
                                   ,iEnd,pBVar12,local_a0);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar10 = (int)sVar19 + 1;
                  uVar7 = 0x1f;
                  if (uVar10 != 0) {
                    for (; uVar10 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                    }
                  }
                  if ((int)((uVar7 ^ 0x1f) + (int)sVar8 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                    sVar19 = 0;
                    sVar8 = sVar9 + 4;
                    local_c0 = piVar15;
                  }
                }
              }
            }
            local_a8 = 999999999;
            sVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS(local_58,(BYTE *)piVar15,iEnd,&local_a8);
            uVar7 = local_4c;
            bVar3 = true;
            if (3 < sVar9) {
              uVar16 = (int)sVar19 + 1;
              uVar10 = 0x1f;
              if (uVar16 != 0) {
                for (; uVar16 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar16 = (int)local_a8 + 1;
              iVar2 = 0x1f;
              if (uVar16 != 0) {
                for (; uVar16 >> iVar2 == 0; iVar2 = iVar2 + -1) {
                }
              }
              if ((int)((uVar10 ^ 0x1f) + (int)sVar8 * 4 + -0x1b) < (int)sVar9 * 4 - iVar2) {
                bVar3 = false;
                sVar19 = local_a8;
                sVar8 = sVar9;
                local_c0 = piVar15;
              }
            }
            if (bVar3) {
              if (local_98 <= piVar15) break;
              piVar15 = (int *)((long)piVar20 + 2);
              uVar6 = (int)local_78 + 2;
              local_78 = (ulong)uVar6;
              if (sVar19 == 0) {
                sVar19 = 0;
              }
              else {
                uVar6 = uVar6 - local_4c;
                pBVar11 = local_70;
                if (uVar6 < (uint)local_88) {
                  pBVar11 = local_80;
                }
                if (((uint)local_90 < uVar6 && 2 < iVar5 - uVar6) &&
                   (*piVar15 == *(int *)(pBVar11 + uVar6))) {
                  pBVar12 = iEnd;
                  if (uVar6 < (uint)local_88) {
                    pBVar12 = local_60;
                  }
                  sVar9 = ZSTD_count_2segments
                                    ((BYTE *)((long)piVar20 + 6),
                                     (BYTE *)((long)(pBVar11 + uVar6) + 4),iEnd,pBVar12,local_a0);
                  if (sVar9 < 0xfffffffffffffffc) {
                    uVar10 = (int)sVar19 + 1;
                    uVar6 = 0x1f;
                    if (uVar10 != 0) {
                      for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                      }
                    }
                    if ((int)((uVar6 ^ 0x1f) + (int)sVar8 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                      sVar19 = 0;
                      sVar8 = sVar9 + 4;
                      local_c0 = piVar15;
                    }
                  }
                }
              }
              local_a8 = 999999999;
              sVar9 = ZSTD_BtFindBestMatch_extDict_selectMLS
                                (local_58,(BYTE *)piVar15,iEnd,&local_a8);
              bVar3 = true;
              if (3 < sVar9) {
                uVar10 = (int)sVar19 + 1;
                uVar6 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                  }
                }
                uVar10 = (int)local_a8 + 1;
                iVar2 = 0x1f;
                if (uVar10 != 0) {
                  for (; uVar10 >> iVar2 == 0; iVar2 = iVar2 + -1) {
                  }
                }
                if ((int)((uVar6 ^ 0x1f) + (int)sVar8 * 4 + -0x18) < (int)sVar9 * 4 - iVar2) {
                  bVar3 = false;
                  sVar19 = local_a8;
                  sVar8 = sVar9;
                  local_c0 = piVar15;
                }
              }
              uVar14 = local_78;
              if (bVar3) break;
            }
            else {
              uVar14 = (ulong)uVar6;
            }
            piVar20 = piVar15;
          } while (piVar15 < local_98);
        }
        psVar4 = local_48;
        piVar15 = local_98;
        if (sVar19 == 0) {
          UVar18 = 1;
          uVar6 = uVar7;
          uVar10 = local_64;
        }
        else {
          pBVar13 = (BYTE *)((long)local_c0 + (2 - (long)(local_70 + sVar19)));
          pBVar12 = local_a0;
          pBVar11 = local_70;
          if ((uint)pBVar13 < (uint)local_88) {
            pBVar12 = local_38;
            pBVar11 = local_80;
          }
          if ((src < local_c0) && (uVar14 = (ulong)pBVar13 & 0xffffffff, pBVar12 < pBVar11 + uVar14)
             ) {
            pBVar11 = pBVar11 + uVar14;
            do {
              piVar20 = (int *)((long)local_c0 + -1);
              pBVar11 = pBVar11 + -1;
              if ((*(BYTE *)piVar20 != *pBVar11) ||
                 (sVar8 = sVar8 + 1, local_c0 = piVar20, piVar20 <= src)) break;
            } while (pBVar12 < pBVar11);
          }
          UVar18 = (int)sVar19 + 1;
          uVar6 = (int)sVar19 - 2;
          uVar10 = uVar7;
        }
        uVar14 = (long)local_c0 - (long)src;
        pBVar12 = local_48->lit;
        pBVar11 = pBVar12 + uVar14;
        do {
          *(undefined8 *)pBVar12 = *src;
          pBVar12 = pBVar12 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar12 < pBVar11);
        local_48->lit = local_48->lit + uVar14;
        if (0xffff < uVar14) {
          local_48->longLengthID = 1;
          local_48->longLengthPos =
               (U32)((ulong)((long)local_48->sequences - (long)local_48->sequencesStart) >> 3);
        }
        psVar1 = local_48->sequences;
        psVar1->litLength = (U16)uVar14;
        psVar1->offset = UVar18;
        if (0xffff < sVar8 - 3) {
          local_48->longLengthID = 2;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar1 - (long)local_48->sequencesStart) >> 3);
        }
        psVar1->matchLength = (U16)(sVar8 - 3);
        local_48->sequences = psVar1 + 1;
        src = (void *)((long)local_c0 + sVar8);
        pBVar11 = local_80;
        uVar14 = local_88;
        uVar17 = local_90;
        piVar20 = (int *)src;
        do {
          uVar7 = uVar6;
          if (piVar15 < piVar20) break;
          uVar7 = (uint)((long)piVar20 - (long)(local_70 + uVar10));
          pBVar12 = local_70;
          if (uVar7 < (uint)uVar14) {
            pBVar12 = pBVar11;
          }
          if (((uint)uVar17 < uVar7 && 2 < iVar5 - uVar7) &&
             (*piVar20 ==
              *(int *)(pBVar12 + ((long)piVar20 - (long)(local_70 + uVar10) & 0xffffffff)))) {
            pBVar11 = iEnd;
            if (uVar7 < (uint)uVar14) {
              pBVar11 = local_60;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)(piVar20 + 1),
                               (BYTE *)((long)(pBVar12 +
                                              ((long)piVar20 - (long)(local_70 + uVar10) &
                                              0xffffffff)) + 4),iEnd,pBVar11,local_a0);
            *(undefined8 *)psVar4->lit = *src;
            psVar1 = psVar4->sequences;
            psVar1->litLength = 0;
            psVar1->offset = 1;
            if (0xffff < sVar8 + 1) {
              psVar4->longLengthID = 2;
              psVar4->longLengthPos =
                   (U32)((ulong)((long)psVar1 - (long)psVar4->sequencesStart) >> 3);
            }
            psVar1->matchLength = (U16)(sVar8 + 1);
            psVar4->sequences = psVar1 + 1;
            src = (void *)((long)piVar20 + sVar8 + 4);
            bVar3 = true;
            pBVar11 = local_80;
            uVar14 = local_88;
            uVar17 = local_90;
            piVar20 = (int *)src;
            uVar7 = uVar6;
            uVar6 = uVar10;
          }
          else {
            bVar3 = false;
            uVar7 = uVar10;
          }
          uVar10 = uVar7;
          uVar7 = uVar6;
        } while (bVar3);
      }
    } while (piVar20 < piVar15);
  }
  *local_40 = uVar7;
  local_40[1] = uVar10;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, 1, 2);
}